

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3LockAndPrepare
              (sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pOld,sqlite3_stmt **ppStmt,
              char **pzTail)

{
  int iVar1;
  int rc;
  bool bVar2;
  
  *ppStmt = (sqlite3_stmt *)0x0;
  iVar1 = sqlite3SafetyCheckOk(db);
  if ((zSql == (char *)0x0) || (iVar1 == 0)) {
    iVar1 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x230f8,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  else {
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    rc = sqlite3Prepare(db,zSql,nBytes,prepFlags,pOld,ppStmt,pzTail);
    if (rc != 0) {
      iVar1 = 0;
      do {
        if (db->mallocFailed != '\0') goto LAB_00129815;
        if (rc == 0x11) {
          sqlite3ResetOneSchema(db,-1);
          bVar2 = iVar1 != 0;
          iVar1 = 1;
          if (bVar2) {
            rc = 0x11;
            goto LAB_00129815;
          }
        }
        else {
          if (rc != 0x201) goto LAB_00129815;
          if (0x18 < iVar1) {
            rc = 0x201;
            goto LAB_00129815;
          }
          iVar1 = iVar1 + 1;
        }
        rc = sqlite3Prepare(db,zSql,nBytes,prepFlags,pOld,ppStmt,pzTail);
      } while (rc != 0);
    }
    rc = 0;
LAB_00129815:
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    if ((rc != 0) || (iVar1 = 0, db->mallocFailed != '\0')) {
      iVar1 = apiHandleError(db,rc);
    }
    (db->busyHandler).nBusy = 0;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar1;
}

Assistant:

static int sqlite3LockAndPrepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pOld,               /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc;
  int cnt = 0;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppStmt==0 ) return SQLITE_MISUSE_BKPT;
#endif
  *ppStmt = 0;
  if( !sqlite3SafetyCheckOk(db)||zSql==0 ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  do{
    /* Make multiple attempts to compile the SQL, until it either succeeds
    ** or encounters a permanent error.  A schema problem after one schema
    ** reset is considered a permanent error. */
    rc = sqlite3Prepare(db, zSql, nBytes, prepFlags, pOld, ppStmt, pzTail);
    assert( rc==SQLITE_OK || *ppStmt==0 );
    if( rc==SQLITE_OK || db->mallocFailed ) break;
  }while( (rc==SQLITE_ERROR_RETRY && (cnt++)<SQLITE_MAX_PREPARE_RETRY)
       || (rc==SQLITE_SCHEMA && (sqlite3ResetOneSchema(db,-1), cnt++)==0) );
  sqlite3BtreeLeaveAll(db);
  rc = sqlite3ApiExit(db, rc);
  assert( (rc&db->errMask)==rc );
  db->busyHandler.nBusy = 0;
  sqlite3_mutex_leave(db->mutex);
  assert( rc==SQLITE_OK || (*ppStmt)==0 );
  return rc;
}